

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

void Abc_ObjSetReverseLevel(Abc_Obj_t *pObj,int LevelR)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Vec_Int_t *pVVar3;
  int in_EDX;
  
  pAVar2 = pObj->pNtk;
  pVVar3 = pAVar2->vLevelsR;
  if (pVVar3 == (Vec_Int_t *)0x0) {
    __assert_fail("pNtk->vLevelsR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcTiming.c"
                  ,0x4be,"void Abc_ObjSetReverseLevel(Abc_Obj_t *, int)");
  }
  Vec_IntFillExtra(pVVar3,pObj->Id + 1,in_EDX);
  iVar1 = pObj->Id;
  if ((-1 < (long)iVar1) && (pVVar3 = pAVar2->vLevelsR, iVar1 < pVVar3->nSize)) {
    pVVar3->pArray[iVar1] = LevelR;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Abc_ObjSetReverseLevel( Abc_Obj_t * pObj, int LevelR )
{
    Abc_Ntk_t * pNtk = pObj->pNtk;
    assert( pNtk->vLevelsR );
    Vec_IntFillExtra( pNtk->vLevelsR, pObj->Id + 1, 0 );
    Vec_IntWriteEntry( pNtk->vLevelsR, pObj->Id, LevelR );
}